

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

void prf_model_clear(prf_model_t *model)

{
  if (model != (prf_model_t *)0x0) {
    model->header = (prf_node_t *)0x0;
    model->mempool_id = 0;
    model->vertex_palette = (prf_node_t *)0x0;
    model->vertextras = (prf_vertex_pool_s **)0x0;
    model->ofversion = 0;
  }
  return;
}

Assistant:

void
prf_model_clear(
    prf_model_t * model )
{
    if ( model != NULL ) {
        model->header = NULL;
        model->mempool_id = 0;
        model->vertex_palette = NULL;
        model->vertextras = NULL;
        model->ofversion = 0;
    }
}